

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_target.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  unsigned_long *puVar3;
  long lVar4;
  ostream *poVar5;
  void *pvVar6;
  size_t remainder;
  unsigned_long local_c8;
  ulong local_c0;
  unsigned_long local_b8;
  ulong local_b0;
  unsigned_long local_a8;
  ulong local_a0;
  unsigned_long local_98;
  ulong local_90;
  unsigned_long local_88;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  Context local_20;
  Context context;
  char **argv_local;
  int argc_local;
  
  context.p = (ContextState *)argv;
  doctest::Context::Context(&local_20,0,(char **)0x0);
  if (1 < argc) {
    iVar2 = isdigit((int)*((context.p)->super_ContextOptions).binary_name.field_0.data.ptr);
    if (iVar2 != 0) {
      pcVar1 = ((context.p)->super_ContextOptions).binary_name.field_0.data.ptr;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar1,&local_41);
      number_trajectories = std::__cxx11::stol(&local_40,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
    }
  }
  if (2 < argc) {
    iVar2 = isdigit((int)**(char **)((long)&((context.p)->super_ContextOptions).binary_name.field_0
                                    + 8));
    if (iVar2 != 0) {
      pcVar1 = *(char **)((long)&((context.p)->super_ContextOptions).binary_name.field_0 + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar1,&local_79);
      seed = std::__cxx11::stoi(&local_78,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
  }
  doctest::Context::applyCommandLine(&local_20,argc,(char **)context.p);
  position_random_1 = number_trajectories / 10;
  local_88 = 250000;
  local_90 = number_trajectories / 0x19;
  puVar3 = std::min<unsigned_long>(&local_88,&local_90);
  position_second_random_3 = *puVar3;
  step_through_3 = 0;
  local_98 = 250000;
  local_a0 = number_trajectories / 0x32;
  puVar3 = std::min<unsigned_long>(&local_98,&local_a0);
  random_direction_3 = *puVar3;
  local_a8 = 250000;
  local_b0 = number_trajectories / 10;
  puVar3 = std::min<unsigned_long>(&local_a8,&local_b0);
  random_discrete_3 = *puVar3;
  velocity_random_3 = number_trajectories / 10;
  local_b8 = 250000;
  local_c0 = number_trajectories / 10;
  puVar3 = std::min<unsigned_long>(&local_b8,&local_c0);
  velocity_random_discrete_3 = *puVar3;
  local_c8 = 250000;
  remainder = number_trajectories / 0x19;
  puVar3 = std::min<unsigned_long>(&local_c8,&remainder);
  velocity_second_random_3 = *puVar3;
  lVar4 = number_trajectories -
          (position_random_1 + step_through_3 + random_direction_3 + velocity_random_3 +
           random_discrete_3 + position_second_random_3 + velocity_second_random_3);
  position_random_3 = (ulong)(lVar4 * 0x5f) / 100;
  random_3_high = (ulong)(lVar4 * 5) / 100;
  poVar5 = std::operator<<((ostream *)&std::cout,"<number_trajectories>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\tPosition (1 DoF): ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,position_random_1);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\tPosition (3 DoF): ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,position_random_3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\tPosition Discrete (3 DoF): ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,random_discrete_3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\tPosition High Limits (3 DoF): ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,random_3_high);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\tPosition Second Order (3 DoF): ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,position_second_random_3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\tPosition Step Through (3 DoF): ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,step_through_3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\tVelocity (3 DoF): ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,velocity_random_3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\tVelocity Discrete (3 DoF): ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,velocity_random_discrete_3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\tVelocity Second Order (3 DoF): ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,velocity_second_random_3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Total: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,number_trajectories);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  iVar2 = doctest::Context::run(&local_20);
  doctest::Context::~Context(&local_20);
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
    doctest::Context context;

    if (argc > 1 && std::isdigit(argv[1][0])) {
        number_trajectories = std::stol(argv[1]);
    }
    if (argc > 2 && std::isdigit(argv[2][0])) {
        seed = std::stoi(argv[2]);
    }

    context.applyCommandLine(argc, argv);

    position_random_1 = number_trajectories / 10;
    position_second_random_3 = std::min<size_t>(250000, number_trajectories / 25);
    step_through_3 = 0; // number_trajectories / 20;
    random_direction_3 = std::min<size_t>(250000, number_trajectories / 50);
    random_discrete_3 = std::min<size_t>(250000, number_trajectories / 10);
    velocity_random_3 = number_trajectories / 10;
    velocity_random_discrete_3 = std::min<size_t>(250000, number_trajectories / 10);
    velocity_second_random_3 = std::min<size_t>(250000, number_trajectories / 25);

    const size_t remainder = number_trajectories - (position_random_1 + step_through_3 + random_direction_3 + velocity_random_3 + random_discrete_3 + position_second_random_3 + velocity_second_random_3); // 1. Normal, 2. High
    position_random_3 = (size_t)(remainder * 95/100);
    random_3_high = (size_t)(remainder * 5/100);

    std::cout << "<number_trajectories>" << std::endl;
    std::cout << "\tPosition (1 DoF): " << position_random_1 << std::endl;
    std::cout << "\tPosition (3 DoF): " << position_random_3 << std::endl;
    std::cout << "\tPosition Discrete (3 DoF): " << random_discrete_3 << std::endl;
    std::cout << "\tPosition High Limits (3 DoF): " << random_3_high << std::endl;
    std::cout << "\tPosition Second Order (3 DoF): " << position_second_random_3 << std::endl;
    std::cout << "\tPosition Step Through (3 DoF): " << step_through_3 << std::endl;
    std::cout << "\tVelocity (3 DoF): " << velocity_random_3 << std::endl;
    std::cout << "\tVelocity Discrete (3 DoF): " << velocity_random_discrete_3 << std::endl;
    std::cout << "\tVelocity Second Order (3 DoF): " << velocity_second_random_3 << std::endl;
    std::cout << "Total: " << number_trajectories << std::endl;

    return context.run();
}